

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O3

bool __thiscall crnd::crn_unpacker::decode_alpha_endpoints(crn_unpacker *this)

{
  symbol_codec *this_00;
  vector<unsigned_short> *this_01;
  byte bVar1;
  byte bVar2;
  crn_header *pcVar3;
  unsigned_short *puVar4;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  uint8 *puVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  static_huffman_data_model dm;
  uint local_68;
  static_huffman_data_model local_58;
  
  pcVar3 = this->m_pHeader;
  uVar9 = (uint)(pcVar3->m_alpha_endpoints).m_size.m_buf[2] |
          (uint)(pcVar3->m_alpha_endpoints).m_size.m_buf[1] << 8 |
          (uint)(pcVar3->m_alpha_endpoints).m_size.m_buf[0] << 0x10;
  if (uVar9 == 0) {
    return false;
  }
  bVar1 = (pcVar3->m_alpha_endpoints).m_num.m_buf[0];
  bVar2 = (pcVar3->m_alpha_endpoints).m_num.m_buf[1];
  this_00 = &this->m_codec;
  puVar8 = this->m_pData +
           ((ulong)(pcVar3->m_alpha_endpoints).m_ofs.m_buf[2] |
           (ulong)((uint)(pcVar3->m_alpha_endpoints).m_ofs.m_buf[0] << 0x10 |
                  (uint)(pcVar3->m_alpha_endpoints).m_ofs.m_buf[1] << 8));
  (this->m_codec).m_pDecode_buf = puVar8;
  (this->m_codec).m_pDecode_buf_next = puVar8;
  (this->m_codec).m_decode_buf_size = uVar9;
  (this->m_codec).m_pDecode_buf_end = puVar8 + uVar9;
  (this->m_codec).m_bit_buf = 0;
  (this->m_codec).m_bit_count = 0;
  local_58.m_total_syms = 0;
  local_58.m_code_sizes.m_p = (uchar *)0x0;
  local_58.m_code_sizes.m_size = 0;
  local_58.m_code_sizes.m_capacity = 0;
  local_58.m_code_sizes.m_alloc_failed = false;
  local_58.m_pDecode_tables = (decoder_tables *)0x0;
  bVar5 = symbol_codec::decode_receive_static_data_model(this_00,&local_58);
  if (bVar5) {
    uVar11 = (uint)bVar1 * 0x100 + (uint)bVar2;
    this_01 = &this->m_alpha_endpoints;
    uVar9 = (this->m_alpha_endpoints).m_size;
    if (uVar9 != uVar11) {
      if (uVar9 <= uVar11) {
        if ((this->m_alpha_endpoints).m_capacity < uVar11) {
          bVar5 = elemental_vector::increase_capacity
                            ((elemental_vector *)this_01,uVar11,uVar9 + 1 == uVar11,2,
                             (object_mover)0x0);
          if (!bVar5) {
            (this->m_alpha_endpoints).m_alloc_failed = true;
            goto LAB_00113bdc;
          }
          uVar9 = (this->m_alpha_endpoints).m_size;
        }
        memset(this_01->m_p + uVar9,0,(ulong)(uVar11 - uVar9) * 2);
      }
      (this->m_alpha_endpoints).m_size = uVar11;
    }
    bVar5 = true;
    if (uVar11 != 0) {
      puVar4 = this_01->m_p;
      lVar10 = 0;
      uVar9 = 0;
      uVar11 = 0;
      do {
        uVar6 = symbol_codec::decode(this_00,&local_58);
        uVar11 = uVar6 + uVar11 & 0xff;
        uVar6 = symbol_codec::decode(this_00,&local_58);
        uVar7 = uVar6 + uVar9;
        uVar9 = uVar7 & 0xff;
        puVar4[lVar10] = (short)uVar7 * 0x100 | (ushort)uVar11;
        lVar10 = lVar10 + 1;
        local_68 = (uint)CONCAT11(bVar1,bVar2);
      } while (local_68 != (uint)lVar10);
      bVar5 = true;
    }
  }
  else {
LAB_00113bdc:
    bVar5 = false;
  }
  static_huffman_data_model::~static_huffman_data_model(&local_58);
  return bVar5;
}

Assistant:

bool decode_alpha_endpoints() {
    const uint32 num_alpha_endpoints = m_pHeader->m_alpha_endpoints.m_num;

    if (!m_codec.start_decoding(m_pData + m_pHeader->m_alpha_endpoints.m_ofs, m_pHeader->m_alpha_endpoints.m_size))
      return false;

    static_huffman_data_model dm;
    if (!m_codec.decode_receive_static_data_model(dm))
      return false;

    if (!m_alpha_endpoints.resize(num_alpha_endpoints))
      return false;

    uint16* CRND_RESTRICT pDst = &m_alpha_endpoints[0];
    uint32 a = 0, b = 0;

    for (uint32 i = 0; i < num_alpha_endpoints; i++) {
      a = (a + m_codec.decode(dm)) & 255;
      b = (b + m_codec.decode(dm)) & 255;
      *pDst++ = (uint16)(a | (b << 8));
    }

    m_codec.stop_decoding();

    return true;
  }